

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

void Acb_NtkCollectNewTfi1_rec(Acb_Ntk_t *p,int iObj,Vec_Int_t *vTfiNew)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  iVar1 = Acb_ObjIsTravIdPrev(p,iObj);
  if (iVar1 != 0) {
    iVar1 = Acb_ObjSetTravIdCur(p,iObj);
    if (iVar1 == 0) {
      piVar2 = Acb_ObjFanins(p,iObj);
      for (lVar3 = 0; lVar3 < *piVar2; lVar3 = lVar3 + 1) {
        Acb_NtkCollectNewTfi1_rec(p,piVar2[lVar3 + 1],vTfiNew);
      }
      Vec_IntPush(vTfiNew,iObj);
      return;
    }
  }
  return;
}

Assistant:

void Acb_NtkCollectNewTfi1_rec( Acb_Ntk_t * p, int iObj, Vec_Int_t * vTfiNew )
{
    int i, iFanin, * pFanins;
    if ( !Acb_ObjIsTravIdPrev(p, iObj) )
        return;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, i )
        Acb_NtkCollectNewTfi1_rec( p, iFanin, vTfiNew );
    Vec_IntPush( vTfiNew, iObj );
}